

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> cppurses::input::get(void)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  Press *this;
  size_t sVar4;
  size_t sVar5;
  undefined8 *puVar6;
  Widget *pWVar7;
  tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_> in_RDI;
  MEVENT mouse_event;
  
  iVar3 = wgetch(_stdscr);
  lVar1 = System::head_;
  if (iVar3 == 0x19a) {
    if (System::head_ == 0) {
      puVar6 = (undefined8 *)0x0;
    }
    else {
      sVar4 = Terminal::width((Terminal *)System::terminal);
      sVar5 = Terminal::height((Terminal *)System::terminal);
      puVar6 = (undefined8 *)operator_new(0x28);
      *(undefined4 *)(puVar6 + 1) = 0xc;
      puVar6[2] = lVar1;
      *puVar6 = &PTR__Event_00164998;
      puVar6[3] = sVar4;
      puVar6[4] = sVar5;
    }
    *(undefined8 **)
     in_RDI.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
     super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl = puVar6;
  }
  else {
    if (iVar3 == 0x199) {
      iVar3 = getmouse();
      if ((iVar3 == 0) && (pWVar7 = detail::find_widget_at(0,0), pWVar7 != (Widget *)0x0)) {
        detail::Border_offset::west(pWVar7);
        detail::Border_offset::north(pWVar7);
      }
    }
    else if (iVar3 != -1) {
      bVar2 = Shortcuts::send_key(Null);
      pWVar7 = Focus::focus_widget_;
      if ((bVar2) || (Focus::focus_widget_ == (Widget *)0x0)) {
        this = (Press *)0x0;
      }
      else {
        this = (Press *)operator_new(0x20);
        Key::Press::Press(this,pWVar7,(Code)iVar3);
      }
      *(Press **)
       in_RDI.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
       super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl = this;
      return (__uniq_ptr_data<cppurses::Event,_std::default_delete<cppurses::Event>,_true,_true>)
             (tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
             in_RDI.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
             .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl;
    }
    *(undefined8 *)
     in_RDI.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
     super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl = 0;
  }
  return (__uniq_ptr_data<cppurses::Event,_std::default_delete<cppurses::Event>,_true,_true>)
         (tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
         in_RDI.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
         super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl;
}

Assistant:

auto get() -> std::unique_ptr<Event>
{
    const auto input = ::getch();
    switch (input) {
        case ERR: return nullptr;  // Timeout and no event.
        case KEY_MOUSE: return make_mouse_event();
        case KEY_RESIZE: return make_resize_event();
        default: return make_keyboard_event(input);  // Key_event
    }
}